

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  char *pcVar1;
  char *__format;
  
  if (action == 1) {
    if (key == 0x43) {
      if (mods == 2) {
        glfwSetClipboardString((GLFWwindow *)0x0,"Hello GLFW World!");
        __format = "Setting clipboard to \"%s\"\n";
        pcVar1 = "Hello GLFW World!";
LAB_00113cab:
        printf(__format,pcVar1);
        return;
      }
    }
    else if (key == 0x56) {
      if (mods == 2) {
        pcVar1 = glfwGetClipboardString((GLFWwindow *)0x0);
        if (pcVar1 == (char *)0x0) {
          puts("Clipboard does not contain a string");
          return;
        }
        __format = "Clipboard contains \"%s\"\n";
        goto LAB_00113cab;
      }
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;

        case GLFW_KEY_V:
            if (mods == MODIFIER)
            {
                const char* string;

                string = glfwGetClipboardString(NULL);
                if (string)
                    printf("Clipboard contains \"%s\"\n", string);
                else
                    printf("Clipboard does not contain a string\n");
            }
            break;

        case GLFW_KEY_C:
            if (mods == MODIFIER)
            {
                const char* string = "Hello GLFW World!";
                glfwSetClipboardString(NULL, string);
                printf("Setting clipboard to \"%s\"\n", string);
            }
            break;
    }
}